

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  MessageLite *extendee_00;
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  KeyValue *pKVar5;
  iterator iVar6;
  KeyValue *local_90;
  KeyValue *it;
  KeyValue *end;
  undefined1 local_70 [8];
  iterator it_1;
  iterator local_50;
  iterator *local_40;
  iterator *end_1;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  int end_field_number_local;
  int start_field_number_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  end_1 = (iterator *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local._0_4_ = end_field_number;
  target_local._4_4_ = start_field_number;
  _end_field_number_local = extendee;
  extendee_local = (MessageLite *)this;
  bVar1 = is_large(this);
  if (bVar1) {
    iVar6 = absl::lts_20240722::container_internal::
            btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
            ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                   *)(this->map_).flat);
    it_1._8_8_ = iVar6.node_;
    local_50.position_ = iVar6.position_;
    local_40 = &local_50;
    local_50.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          *)it_1._8_8_;
    iVar6 = absl::lts_20240722::container_internal::
            btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
            ::lower_bound<int>((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                                *)(this->map_).flat,(key_arg<int> *)((long)&target_local + 4));
    local_70 = (undefined1  [8])iVar6.node_;
    it_1.node_._0_4_ = iVar6.position_;
    while( true ) {
      bVar2 = absl::lts_20240722::container_internal::
              btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
              ::operator!=((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                            *)local_70,local_40);
      bVar1 = false;
      if (bVar2) {
        ppVar3 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                 ::operator->((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                               *)local_70);
        bVar1 = ppVar3->first < (int)target_local;
      }
      if (!bVar1) break;
      ppVar3 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator->((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                             *)local_70);
      extendee_00 = _end_field_number_local;
      ppVar4 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
               ::operator->((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                             *)local_70);
      stream_local = (EpsCopyOutputStream *)
                     Extension::InternalSerializeFieldWithCachedSizesToArray
                               (&ppVar3->second,extendee_00,this,ppVar4->first,
                                (uint8_t *)stream_local,(EpsCopyOutputStream *)end_1);
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
      ::operator++((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    *)local_70);
    }
    this_local = (ExtensionSet *)stream_local;
  }
  else {
    pKVar5 = flat_end(this);
    local_90 = flat_begin(this);
    while( true ) {
      bVar1 = false;
      if (local_90 != pKVar5) {
        bVar1 = local_90->first < target_local._4_4_;
      }
      if (!bVar1) break;
      local_90 = local_90 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (local_90 != pKVar5) {
        bVar1 = local_90->first < (int)target_local;
      }
      if (!bVar1) break;
      stream_local = (EpsCopyOutputStream *)
                     Extension::InternalSerializeFieldWithCachedSizesToArray
                               (&local_90->second,_end_field_number_local,this,local_90->first,
                                (uint8_t *)stream_local,(EpsCopyOutputStream *)end_1);
      local_90 = local_90 + 1;
    }
    this_local = (ExtensionSet *)stream_local;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeImpl(
    const MessageLite* extendee, int start_field_number, int end_field_number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    const auto& end = map_.large->end();
    for (auto it = map_.large->lower_bound(start_field_number);
         it != end && it->first < end_field_number; ++it) {
      target = it->second.InternalSerializeFieldWithCachedSizesToArray(
          extendee, this, it->first, target, stream);
    }
    return target;
  }
  const KeyValue* end = flat_end();
  const KeyValue* it = flat_begin();
  while (it != end && it->first < start_field_number) ++it;
  for (; it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        extendee, this, it->first, target, stream);
  }
  return target;
}